

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMerge.c
# Opt level: O1

Vec_Int_t * Abc_NtkLutMerge(Abc_Ntk_t *pNtk,Nwk_LMPars_t *pPars)

{
  uint uVar1;
  void *pvVar2;
  Abc_Obj_t *pLut;
  Vec_Int_t *pVVar3;
  Vec_Ptr_t *__ptr;
  Nwk_Grf_t *pNVar4;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Vec_Ptr_t *vCands;
  long lVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  timespec ts;
  timespec local_98;
  Vec_Ptr_t *local_88;
  Vec_Ptr_t *local_80;
  uint local_74;
  long local_70;
  Abc_Ntk_t *local_68;
  Vec_Ptr_t *local_60;
  Vec_Ptr_t *local_58;
  Nwk_Grf_t *local_50;
  Nwk_LMPars_t *local_48;
  ulong local_40;
  ulong local_38;
  
  iVar5 = clock_gettime(3,&local_98);
  if (iVar5 < 0) {
    local_70 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98.tv_nsec),8);
    local_70 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_98.tv_sec * -1000000;
  }
  lVar8 = (long)pNtk->vObjs->nSize;
  uVar11 = 0;
  iVar5 = 0;
  if (0 < lVar8) {
    lVar9 = 0;
    iVar5 = 0;
    do {
      pvVar2 = pNtk->vObjs->pArray[lVar9];
      if ((pvVar2 != (void *)0x0) && ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 7)) {
        iVar5 = iVar5 + (uint)(*(int *)((long)pvVar2 + 0x1c) <= pPars->nMaxLutSize);
      }
      lVar9 = lVar9 + 1;
    } while (lVar8 != lVar9);
  }
  local_50 = Nwk_ManGraphAlloc(iVar5);
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(8000);
  pVVar6->pArray = ppvVar7;
  local_58 = pVVar6;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(8000);
  pVVar6->pArray = ppvVar7;
  local_60 = pVVar6;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(8000);
  pVVar6->pArray = ppvVar7;
  local_88 = pVVar6;
  vCands = (Vec_Ptr_t *)malloc(0x10);
  vCands->nCap = 1000;
  vCands->nSize = 0;
  ppvVar7 = (void **)malloc(8000);
  vCands->pArray = ppvVar7;
  pVVar6 = pNtk->vObjs;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    uVar11 = 0;
    local_80 = vCands;
    local_68 = pNtk;
    local_48 = pPars;
    do {
      pLut = (Abc_Obj_t *)pVVar6->pArray[lVar8];
      if (((pLut != (Abc_Obj_t *)0x0) && ((*(uint *)&pLut->field_0x14 & 0xf) == 7)) &&
         ((pLut->vFanins).nSize <= pPars->nMaxLutSize)) {
        Abc_NtkCollectOverlapCands(pLut,local_88,pPars);
        if (pPars->fUseDiffSupp != 0) {
          Abc_NtkCollectNonOverlapCands(pLut,local_58,local_60,vCands,pPars);
        }
        pNVar4 = local_50;
        uVar13 = (ulong)(uint)local_88->nSize;
        if ((uVar13 != 0) || (vCands->nSize != 0)) {
          local_40 = (ulong)(uint)vCands->nSize;
          local_74 = uVar11;
          if (0 < local_88->nSize) {
            ppvVar7 = local_88->pArray;
            uVar12 = 0;
            do {
              Nwk_ManGraphHashEdge(pNVar4,pLut->Id,*(int *)((long)ppvVar7[uVar12] + 0x10));
              uVar12 = uVar12 + 1;
            } while (uVar13 != uVar12);
          }
          uVar12 = local_40;
          iVar5 = (int)local_40;
          local_38 = uVar13;
          if (0 < iVar5) {
            ppvVar7 = local_80->pArray;
            uVar13 = 0;
            do {
              Nwk_ManGraphHashEdge(pNVar4,pLut->Id,*(int *)((long)ppvVar7[uVar13] + 0x10));
              uVar13 = uVar13 + 1;
            } while (uVar12 != uVar13);
          }
          pPars = local_48;
          uVar11 = local_74 + (int)local_38 + iVar5;
          vCands = local_80;
          pNtk = local_68;
          if (local_48->fVeryVerbose != 0) {
            uVar1 = (pLut->vFanins).nSize;
            printf("Node %6d : Fanins = %d. Fanouts = %3d.  Cand1 = %3d. Cand2 = %3d.\n",
                   (ulong)(uint)pLut->Id,(ulong)uVar1,(ulong)uVar1,local_38,uVar12 & 0xffffffff);
            vCands = local_80;
            pNtk = local_68;
          }
        }
      }
      lVar8 = lVar8 + 1;
      pVVar6 = pNtk->vObjs;
    } while (lVar8 < pVVar6->nSize);
  }
  pVVar6 = local_58;
  if (local_58->pArray != (void **)0x0) {
    free(local_58->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  free(pVVar6);
  pNVar4 = local_50;
  __ptr = local_60;
  pVVar6 = local_88;
  if (local_60->pArray != (void **)0x0) {
    free(local_60->pArray);
    __ptr->pArray = (void **)0x0;
  }
  free(__ptr);
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  free(pVVar6);
  if (vCands->pArray != (void **)0x0) {
    free(vCands->pArray);
    vCands->pArray = (void **)0x0;
  }
  free(vCands);
  if (pPars->fVerbose != 0) {
    iVar5 = 0x9519cd;
    printf("Mergable LUTs = %6d. Total cands = %6d. ",(ulong)(uint)pNVar4->nVertsMax,(ulong)uVar11);
    Abc_Print(iVar5,"%s =","Deriving graph");
    iVar10 = 3;
    iVar5 = clock_gettime(3,&local_98);
    if (iVar5 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
    }
    Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar8 + local_70) / 1000000.0);
  }
  iVar5 = clock_gettime(3,&local_98);
  if (iVar5 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_98.tv_sec * -1000000;
  }
  Nwk_ManGraphSolve(pNVar4);
  if (pPars->fVerbose != 0) {
    iVar5 = 0x951a05;
    printf("GRAPH: Nodes = %6d. Edges = %6d.  Pairs = %6d.  ",(ulong)(uint)pNVar4->nVerts,
           (ulong)(uint)pNVar4->nEdges,(ulong)(uint)(pNVar4->vPairs->nSize / 2));
    Abc_Print(iVar5,"%s =","Solving");
    iVar10 = 3;
    iVar5 = clock_gettime(3,&local_98);
    if (iVar5 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
    }
    Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar9 + lVar8) / 1000000.0);
    Nwk_ManGraphReportMemoryUsage(pNVar4);
  }
  pVVar3 = pNVar4->vPairs;
  pNVar4->vPairs = (Vec_Int_t *)0x0;
  Nwk_ManGraphFree(pNVar4);
  return pVVar3;
}

Assistant:

Vec_Int_t * Abc_NtkLutMerge( Abc_Ntk_t * pNtk, Nwk_LMPars_t * pPars )
{
    Nwk_Grf_t * p;
    Vec_Int_t * vResult;
    Vec_Ptr_t * vStart, * vNext, * vCands1, * vCands2;
    Abc_Obj_t * pLut, * pCand;
    int i, k, nVertsMax, nCands;
    abctime clk = Abc_Clock();
    // count the number of vertices
    nVertsMax = 0;
    Abc_NtkForEachNode( pNtk, pLut, i )
        nVertsMax += (int)(Abc_ObjFaninNum(pLut) <= pPars->nMaxLutSize);
    p = Nwk_ManGraphAlloc( nVertsMax );
    // create graph
    vStart  = Vec_PtrAlloc( 1000 );
    vNext   = Vec_PtrAlloc( 1000 );
    vCands1 = Vec_PtrAlloc( 1000 );
    vCands2 = Vec_PtrAlloc( 1000 );
    nCands  = 0;
    Abc_NtkForEachNode( pNtk, pLut, i )
    {
        if ( Abc_ObjFaninNum(pLut) > pPars->nMaxLutSize )
            continue;
        Abc_NtkCollectOverlapCands( pLut, vCands1, pPars );
        if ( pPars->fUseDiffSupp )
            Abc_NtkCollectNonOverlapCands( pLut, vStart, vNext, vCands2, pPars );
        if ( Vec_PtrSize(vCands1) == 0 && Vec_PtrSize(vCands2) == 0 )
            continue;
        nCands += Vec_PtrSize(vCands1) + Vec_PtrSize(vCands2);
        // save candidates
        Vec_PtrForEachEntry( Abc_Obj_t *, vCands1, pCand, k )
            Nwk_ManGraphHashEdge( p, Abc_ObjId(pLut), Abc_ObjId(pCand) );
        Vec_PtrForEachEntry( Abc_Obj_t *, vCands2, pCand, k )
            Nwk_ManGraphHashEdge( p, Abc_ObjId(pLut), Abc_ObjId(pCand) );
        // print statistics about this node
        if ( pPars->fVeryVerbose )
        printf( "Node %6d : Fanins = %d. Fanouts = %3d.  Cand1 = %3d. Cand2 = %3d.\n",
            Abc_ObjId(pLut), Abc_ObjFaninNum(pLut), Abc_ObjFaninNum(pLut), 
            Vec_PtrSize(vCands1), Vec_PtrSize(vCands2) );
    }
    Vec_PtrFree( vStart );
    Vec_PtrFree( vNext );
    Vec_PtrFree( vCands1 );
    Vec_PtrFree( vCands2 );
    if ( pPars->fVerbose )
    {
        printf( "Mergable LUTs = %6d. Total cands = %6d. ", p->nVertsMax, nCands );
        ABC_PRT( "Deriving graph", Abc_Clock() - clk );
    }
    // solve the graph problem
    clk = Abc_Clock();
    Nwk_ManGraphSolve( p );
    if ( pPars->fVerbose )
    {
        printf( "GRAPH: Nodes = %6d. Edges = %6d.  Pairs = %6d.  ", 
            p->nVerts, p->nEdges, Vec_IntSize(p->vPairs)/2 );
        ABC_PRT( "Solving", Abc_Clock() - clk );
        Nwk_ManGraphReportMemoryUsage( p );
    }
    vResult = p->vPairs; p->vPairs = NULL;
/*
    for ( i = 0; i < vResult->nSize; i += 2 )
        printf( "(%d,%d) ", vResult->pArray[i], vResult->pArray[i+1] );
    printf( "\n" );
*/
    Nwk_ManGraphFree( p );
    return vResult;
}